

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Combo(char *label,int *current_item,char *items_separated_by_zeros,int height_in_items)

{
  bool bVar1;
  size_t sVar2;
  char *in_RDX;
  bool value_changed;
  char *p;
  int items_count;
  char *in_stack_00000038;
  char *local_28;
  
  for (local_28 = in_RDX; *local_28 != '\0'; local_28 = local_28 + sVar2 + 1) {
    sVar2 = strlen(local_28);
  }
  bVar1 = Combo(in_stack_00000038,(int *)label,(_func_bool_void_ptr_int_char_ptr_ptr *)current_item,
                items_separated_by_zeros,height_in_items,items_count);
  return bVar1;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* items_separated_by_zeros, int height_in_items)
{
    int items_count = 0;
    const char* p = items_separated_by_zeros;       // FIXME-OPT: Avoid computing this, or at least only when combo is open
    while (*p)
    {
        p += strlen(p) + 1;
        items_count++;
    }
    bool value_changed = Combo(label, current_item, Items_SingleStringGetter, (void*)items_separated_by_zeros, items_count, height_in_items);
    return value_changed;
}